

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx512::create_pipeline(Deconvolution_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  int k;
  int _w;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 *puVar17;
  int _h;
  int iVar18;
  int iVar19;
  int i;
  ulong uVar20;
  ulong local_128;
  ulong local_120;
  Mat local_c8;
  Mat local_78;
  
  p_Var1 = this->_vptr_Deconvolution_x86_avx512[-3];
  uVar10 = (long)*(int *)(&this->field_0xd8 + (long)p_Var1) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
  _w = (int)uVar10;
  uVar11 = (long)*(int *)(&this->field_0x110 + (long)p_Var1) / (long)_w;
  uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
           (long)*(int *)(&this->field_0xd0 + (long)p_Var1);
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.c = 0;
  iVar18 = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  Mat::create(&local_c8,
              *(int *)(&this->field_0x18c + (long)this->_vptr_Deconvolution_x86_avx512[-3]),4,
              (Allocator *)0x0);
  pp_Var2 = this->_vptr_Deconvolution_x86_avx512;
  uVar7 = *(uint *)(&this->field_0xd0 + (long)pp_Var2[-3]);
  _h = (int)uVar11;
  if (0 < (int)(uVar7 * _h)) {
    lVar8 = *(long *)(&this->field_0x160 + (long)pp_Var2[-3]);
    puVar12 = (undefined4 *)((long)local_c8.data + uVar10 * 4 + -4);
    do {
      if (0 < _w) {
        uVar15 = 0;
        puVar17 = puVar12;
        do {
          *puVar17 = *(undefined4 *)(lVar8 + uVar15 * 4);
          uVar15 = uVar15 + 1;
          puVar17 = puVar17 + -1;
        } while ((uVar10 & 0xffffffff) != uVar15);
      }
      iVar18 = iVar18 + 1;
      uVar7 = *(uint *)(&this->field_0xd0 + (long)pp_Var2[-3]);
      lVar8 = lVar8 + uVar10 * 4;
      puVar12 = puVar12 + uVar10;
    } while (iVar18 < (int)(uVar7 * _h));
  }
  local_128 = 1;
  uVar15 = 1;
  if (opt->use_packing_layout != false) {
    uVar15 = 0x10;
    local_128 = 0x10;
    if ((uVar11 & 0xf) != 0) {
      if ((uVar11 & 7) == 0) {
        local_128 = 8;
      }
      else {
        local_128 = (ulong)((uint)((uVar11 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar7 & 0xf) != 0) {
      if ((uVar7 & 7) == 0) {
        uVar15 = 8;
      }
      else {
        uVar15 = (ulong)((uint)((uVar7 & 3) == 0) * 3 + 1);
      }
    }
  }
  Mat::reshape(&local_78,&local_c8,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]),
               (Allocator *)0x0);
  iVar18 = (int)local_128;
  iVar19 = (int)uVar15;
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / (long)iVar18),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) / iVar19,
              (ulong)(uint)(iVar19 * iVar18 * 4),iVar19 * iVar18,(Allocator *)0x0);
  pp_Var2 = this->_vptr_Deconvolution_x86_avx512;
  if (iVar19 <= *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).cstep;
    sVar5 = (this->weight_data_tm).elemsize;
    local_120 = 0;
    do {
      if (iVar18 <= _h) {
        puVar12 = (undefined4 *)(((local_120 & 0xffffffff) / uVar15) * sVar4 * sVar5 + (long)pvVar3)
        ;
        puVar17 = (undefined4 *)
                  (local_78.cstep * local_78.elemsize * local_120 + (long)local_78.data);
        lVar8 = 0;
        do {
          if (0 < _w) {
            uVar11 = 0;
            puVar9 = puVar17;
            do {
              uVar20 = 0;
              uVar16 = uVar15;
              puVar14 = puVar9;
              puVar13 = puVar9;
              do {
                do {
                  *puVar12 = *puVar14;
                  puVar12 = puVar12 + 1;
                  uVar16 = uVar16 - 1;
                  puVar14 = (undefined4 *)((long)puVar14 + local_78.cstep * local_78.elemsize);
                } while (uVar16 != 0);
                uVar20 = uVar20 + 1;
                puVar14 = (undefined4 *)((long)puVar13 + (long)local_78.w * local_78.elemsize);
                uVar16 = uVar15;
                puVar13 = puVar14;
              } while (uVar20 != local_128);
              uVar11 = uVar11 + 1;
              puVar9 = puVar9 + 1;
            } while (uVar11 != (uVar10 & 0xffffffff));
          }
          lVar8 = lVar8 + local_128;
          puVar17 = (undefined4 *)((long)puVar17 + (long)local_78.w * local_78.elemsize * local_128)
          ;
        } while (lVar8 < (long)((long)_h - (ulong)(iVar18 - 1)));
      }
      local_120 = local_120 + uVar15;
    } while ((long)((iVar19 - 1) + local_120) <
             (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var1 = this->_vptr_Deconvolution_x86_avx512[-3];
    piVar6 = *(int **)(&this->field_0x168 + (long)p_Var1);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var1) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var1));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var1) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var1) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var1) = 0;
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx512::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}